

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatActivity.c
# Opt level: O2

void Msat_SolverClaBumpActivity(Msat_Solver_t *p,Msat_Clause_t *pC)

{
  float fVar1;
  double dVar2;
  
  fVar1 = Msat_ClauseReadActivity(pC);
  dVar2 = p->dClaInc;
  if (1e+20 < (double)fVar1 + dVar2) {
    Msat_SolverClaRescaleActivity(p);
    fVar1 = Msat_ClauseReadActivity(pC);
    dVar2 = p->dClaInc;
  }
  Msat_ClauseWriteActivity(pC,(float)dVar2 + fVar1);
  return;
}

Assistant:

void Msat_SolverClaBumpActivity( Msat_Solver_t * p, Msat_Clause_t * pC )
{
    float Activ;
    Activ = Msat_ClauseReadActivity(pC);
    if ( Activ + p->dClaInc > 1e20 )
    {
        Msat_SolverClaRescaleActivity( p );
        Activ = Msat_ClauseReadActivity( pC );
    }
    Msat_ClauseWriteActivity( pC, Activ + (float)p->dClaInc );
}